

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int ARKodeGetRootInfo(void *arkode_mem,int *rootsfound)

{
  long lVar1;
  long lVar2;
  int line;
  
  if (arkode_mem == (void *)0x0) {
    arkode_mem = (ARKodeMem)0x0;
    line = 0x924;
  }
  else {
    lVar1 = *(long *)((long)arkode_mem + 0x3a0);
    if (lVar1 != 0) {
      for (lVar2 = 0; lVar2 < *(int *)(lVar1 + 8); lVar2 = lVar2 + 1) {
        rootsfound[lVar2] = *(int *)(*(long *)(lVar1 + 0x10) + lVar2 * 4);
      }
      return 0;
    }
    line = 0x92b;
  }
  arkProcessError((ARKodeMem)arkode_mem,-0x15,line,"ARKodeGetRootInfo",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                  ,"arkode_mem = NULL illegal.");
  return -0x15;
}

Assistant:

int ARKodeGetRootInfo(void* arkode_mem, int* rootsfound)
{
  int i;
  ARKodeMem ark_mem;
  ARKodeRootMem ark_root_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;
  if (ark_mem->root_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_root_mem = (ARKodeRootMem)ark_mem->root_mem;
  for (i = 0; i < ark_root_mem->nrtfn; i++)
  {
    rootsfound[i] = ark_root_mem->iroots[i];
  }
  return (ARK_SUCCESS);
}